

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rANS_byte.h
# Opt level: O0

void RansEncFlush(RansState *r,uint8_t **pptr)

{
  RansState RVar1;
  uint8_t *puVar2;
  uint8_t *ptr;
  uint32_t x;
  uint8_t **pptr_local;
  RansState *r_local;
  
  RVar1 = *r;
  puVar2 = *pptr;
  puVar2[-4] = (uint8_t)RVar1;
  puVar2[-3] = (uint8_t)(RVar1 >> 8);
  puVar2[-2] = (uint8_t)(RVar1 >> 0x10);
  puVar2[-1] = (uint8_t)(RVar1 >> 0x18);
  *pptr = puVar2 + -4;
  return;
}

Assistant:

static inline void RansEncFlush(RansState* r, uint8_t** pptr)
{
    uint32_t x = *r;
    uint8_t* ptr = *pptr;

    ptr -= 4;
    ptr[0] = (uint8_t) (x >> 0);
    ptr[1] = (uint8_t) (x >> 8);
    ptr[2] = (uint8_t) (x >> 16);
    ptr[3] = (uint8_t) (x >> 24);

    *pptr = ptr;
}